

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist.c
# Opt level: O3

size_t wordlist_lookup_word(words *w,char *word)

{
  ulong uVar1;
  int iVar2;
  char **ppcVar3;
  char **ppcVar4;
  ulong uVar5;
  
  if (w->sorted == false) {
    uVar1 = w->len;
    if (uVar1 == 0) {
      return 0;
    }
    ppcVar4 = w->indices;
    uVar5 = 1;
    do {
      iVar2 = strcmp(word,*ppcVar4);
      ppcVar3 = ppcVar4;
      if (iVar2 != 0) {
        ppcVar3 = (char **)0x0;
      }
      if (uVar1 <= uVar5) break;
      uVar5 = uVar5 + 1;
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar3 == (char **)0x0);
  }
  else {
    ppcVar3 = (char **)bsearch(word,w->indices,w->len,8,bstrcmp);
  }
  if (ppcVar3 == (char **)0x0) {
    return 0;
  }
  return ((long)ppcVar3 - (long)w->indices >> 3) + 1;
}

Assistant:

size_t wordlist_lookup_word(const struct words *w, const char *word)
{
    const size_t size = sizeof(const char *);
    const char **found = NULL;

    if (w->sorted)
        found = (const char **)bsearch(word, w->indices, w->len, size, bstrcmp);
    else {
        size_t i;
        for (i = 0; i < w->len && !found; ++i)
            if (!strcmp(word, w->indices[i]))
                found = w->indices + i;
    }
    return found ? found - w->indices + 1u : 0u;
}